

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O1

int libwebvtt::Parser::ParseNumber(string *line,size_type *idx_ptr)

{
  uint uVar1;
  ulong uVar2;
  pointer pcVar3;
  bool bVar4;
  size_type sVar5;
  int iVar6;
  int iVar7;
  
  if ((((idx_ptr != (size_type *)0x0) && (uVar2 = *idx_ptr, uVar2 != 0xffffffffffffffff)) &&
      (uVar2 < line->_M_string_length)) &&
     (pcVar3 = (line->_M_dataplus)._M_p, (int)pcVar3[uVar2] - 0x30U < 10)) {
    sVar5 = *idx_ptr;
    iVar6 = 0;
    do {
      iVar7 = (int)pcVar3[sVar5];
      uVar1 = iVar7 - 0x30;
      if (9 < uVar1) {
        return iVar6;
      }
      if (iVar6 < 0xccccccd) {
        iVar6 = iVar6 * 10;
        if (-0x7fffffd1 - iVar7 < iVar6) goto LAB_0010e5c5;
        iVar6 = uVar1 + iVar6;
        sVar5 = sVar5 + 1;
        *idx_ptr = sVar5;
        bVar4 = true;
      }
      else {
LAB_0010e5c5:
        bVar4 = false;
      }
    } while (bVar4);
  }
  return -1;
}

Assistant:

int Parser::ParseNumber(const std::string& line,
                        std::string::size_type* idx_ptr) {
  if (idx_ptr == NULL)
    return -1;

  std::string::size_type& idx = *idx_ptr;

  if (idx == std::string::npos || idx >= line.length())
    return -1;

  if (!isdigit(line[idx]))
    return -1;

  int result = 0;

  while (isdigit(line[idx])) {
    const char c = line[idx];
    const int i = c - '0';

    if (result > INT_MAX / 10)
      return -1;

    result *= 10;

    if (result > INT_MAX - i)
      return -1;

    result += i;

    ++idx;
  }

  return result;
}